

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emitter.cpp
# Opt level: O0

void __thiscall YAML::Emitter::FlowSeqPrepareNode(Emitter *this,value child)

{
  bool bVar1;
  size_t n_;
  pointer pEVar2;
  size_t sVar3;
  int in_ESI;
  EmitterState *in_RDI;
  size_t lastIndent;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  EmitterState *in_stack_ffffffffffffffd0;
  IndentTo in_stack_ffffffffffffffe0;
  undefined1 requireSpace;
  undefined4 in_stack_fffffffffffffff0;
  
  std::unique_ptr<YAML::EmitterState,_std::default_delete<YAML::EmitterState>_>::operator->
            ((unique_ptr<YAML::EmitterState,_std::default_delete<YAML::EmitterState>_> *)0xef7f3c);
  n_ = EmitterState::LastIndent(in_RDI);
  pEVar2 = std::unique_ptr<YAML::EmitterState,_std::default_delete<YAML::EmitterState>_>::operator->
                     ((unique_ptr<YAML::EmitterState,_std::default_delete<YAML::EmitterState>_> *)
                      0xef7f53);
  bVar1 = EmitterState::HasBegunNode(pEVar2);
  if (!bVar1) {
    bVar1 = ostream_wrapper::comment((ostream_wrapper *)&in_RDI->m_lastError);
    if (bVar1) {
      YAML::operator<<((ostream_wrapper *)in_stack_ffffffffffffffd0,
                       (char (*) [2])CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
    }
    in_stack_ffffffffffffffd0 = (EmitterState *)&in_RDI->m_lastError;
    IndentTo::IndentTo((IndentTo *)&stack0xffffffffffffffe0,n_);
    YAML::operator<<((ostream_wrapper *)in_stack_ffffffffffffffd0,
                     (IndentTo *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
    std::unique_ptr<YAML::EmitterState,_std::default_delete<YAML::EmitterState>_>::operator->
              ((unique_ptr<YAML::EmitterState,_std::default_delete<YAML::EmitterState>_> *)0xef7fc2)
    ;
    sVar3 = EmitterState::CurGroupChildCount(in_stack_ffffffffffffffd0);
    if (sVar3 == 0) {
      YAML::operator<<((ostream_wrapper *)in_stack_ffffffffffffffd0,
                       (char (*) [2])CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
    }
    else {
      YAML::operator<<((ostream_wrapper *)in_stack_ffffffffffffffd0,
                       (char (*) [2])CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
    }
  }
  requireSpace = (undefined1)(n_ >> 0x38);
  if ((in_ESI != 0) && ((in_ESI - 1U < 3 || ((in_ESI != 4 && (in_ESI == 5)))))) {
    pEVar2 = std::unique_ptr<YAML::EmitterState,_std::default_delete<YAML::EmitterState>_>::
             operator->((unique_ptr<YAML::EmitterState,_std::default_delete<YAML::EmitterState>_> *)
                        0xef8046);
    bVar1 = EmitterState::HasBegunContent(pEVar2);
    if (!bVar1) {
      std::unique_ptr<YAML::EmitterState,_std::default_delete<YAML::EmitterState>_>::operator->
                ((unique_ptr<YAML::EmitterState,_std::default_delete<YAML::EmitterState>_> *)
                 0xef8065);
      EmitterState::CurGroupChildCount(in_stack_ffffffffffffffd0);
    }
    SpaceOrIndentTo((Emitter *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),(bool)requireSpace,
                    in_stack_ffffffffffffffe0.n);
  }
  return;
}

Assistant:

void Emitter::FlowSeqPrepareNode(EmitterNodeType::value child) {
  const std::size_t lastIndent = m_pState->LastIndent();

  if (!m_pState->HasBegunNode()) {
    if (m_stream.comment())
      m_stream << "\n";
    m_stream << IndentTo(lastIndent);
    if (m_pState->CurGroupChildCount() == 0)
      m_stream << "[";
    else
      m_stream << ",";
  }

  switch (child) {
    case EmitterNodeType::NoType:
      break;
    case EmitterNodeType::Property:
    case EmitterNodeType::Scalar:
    case EmitterNodeType::FlowSeq:
    case EmitterNodeType::FlowMap:
      SpaceOrIndentTo(
          m_pState->HasBegunContent() || m_pState->CurGroupChildCount() > 0,
          lastIndent);
      break;
    case EmitterNodeType::BlockSeq:
    case EmitterNodeType::BlockMap:
      assert(false);
      break;
  }
}